

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O2

void __thiscall
Functional::gnunorm(Functional *this,double xsr,double ysr,double dispx,double dispy,int count)

{
  Group group;
  _Vector_base<Point,_std::allocator<Point>_> local_38;
  _Vector_base<Point,_std::allocator<Point>_> local_20;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Group::make_group((Group *)&local_38,xsr,ysr,dispx,dispy,count);
  std::vector<Point,_std::allocator<Point>_>::vector
            ((vector<Point,_std::allocator<Point>_> *)&local_20,
             (vector<Point,_std::allocator<Point>_> *)&local_38);
  Field::add(&this->f,(Group *)&local_20);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_20);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void Functional::gnunorm(double xsr, double ysr, double dispx, double dispy, int count) {
    Group group;
    group.make_group(xsr, ysr, dispx, dispy, count);
    f.add(group);

}